

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::FieldDescriptor::legacy_enum_field_treated_as_closed(FieldDescriptor *this)

{
  ConstType pCVar1;
  EnumDescriptor *pEVar2;
  bool bVar3;
  
  if (this->type_ == '\x0e') {
    pCVar1 = FeatureSet::
             GetExtension<google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false,_0>
                       (this->merged_features_,
                        (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::CppFeatures>,_(unsigned_char)__v_,_false>
                         *)&pb::cpp);
    bVar3 = true;
    if ((pCVar1->field_0)._impl_.legacy_closed_enum_ == false) {
      pEVar2 = enum_type(this);
      bVar3 = (pEVar2->merged_features_->field_0)._impl_.enum_type_ == 2;
    }
    return bVar3;
  }
  return false;
}

Assistant:

bool FieldDescriptor::legacy_enum_field_treated_as_closed() const {
  return type() == TYPE_ENUM &&
         (features().GetExtension(pb::cpp).legacy_closed_enum() ||
          enum_type()->is_closed());
}